

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::decode_next_row(jpeg_decoder *this)

{
  short *psVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long in_RDI;
  int kt_2;
  int kt_1;
  int n_1;
  int kt;
  int n;
  int extra_bits;
  int k;
  huff_tables *pH;
  int prev_num_set;
  int s;
  int r;
  jpgd_quant_t *q;
  int component_id;
  int mcu_block;
  jpgd_block_t *p;
  int mcu_row;
  int in_stack_000001cc;
  jpeg_decoder *in_stack_000001d0;
  int local_78;
  jpgd_status in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int local_5c;
  int local_58;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  jpgd_status in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  jpeg_decoder *in_stack_ffffffffffffffc0;
  int local_2c;
  int local_1c;
  short *local_18;
  int local_c;
  
  local_c = 0;
  do {
    if (*(int *)(in_RDI + 0x24c) <= local_c) {
      return;
    }
    if ((*(int *)(in_RDI + 0x24c4) != 0) && (*(int *)(in_RDI + 0x24c8) == 0)) {
      process_restart((jpeg_decoder *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
      ;
    }
    local_18 = *(short **)(in_RDI + 0x2500);
    for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x244); local_1c = local_1c + 1) {
      iVar3 = *(int *)(in_RDI + 0x254 + (long)local_1c * 4);
      psVar1 = *(short **)(in_RDI + 0x170 + (long)*(int *)(in_RDI + 0x1b8 + (long)iVar3 * 4) * 8);
      uVar2 = huff_decode(in_stack_ffffffffffffffc0,
                          (huff_tables *)
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                          (int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      in_stack_ffffffffffffff94 = local_2c;
      if (local_2c < *(int *)(s_extend_test + (long)(int)(uVar2 & 0xf) * 4)) {
        in_stack_ffffffffffffff94 =
             local_2c + *(int *)(s_extend_offset + (long)(int)(uVar2 & 0xf) * 4);
      }
      iVar4 = *(int *)(in_RDI + 0x24ec + (long)iVar3 * 4) + in_stack_ffffffffffffff94;
      *(int *)(in_RDI + 0x24ec + (long)iVar3 * 4) = iVar4;
      *local_18 = (short)iVar4 * *psVar1;
      iVar4 = *(int *)(in_RDI + 0x2508 + (long)local_1c * 4);
      in_stack_ffffffffffffffc0 =
           *(jpeg_decoder **)(in_RDI + 0x290 + (long)*(int *)(in_RDI + 0x21c + (long)iVar3 * 4) * 8)
      ;
      for (in_stack_ffffffffffffffbc = 1; in_stack_ffffffffffffffbc < 0x40;
          in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc + 1) {
        uVar2 = huff_decode(in_stack_ffffffffffffffc0,
                            (huff_tables *)
                            CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                            (int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        local_2c = (int)uVar2 >> 4;
        uVar2 = uVar2 & 0xf;
        if (uVar2 == 0) {
          if (local_2c != 0xf) break;
          if (0x40 < in_stack_ffffffffffffffbc + 0x10) {
            stop_decoding((jpeg_decoder *)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff8c);
          }
          if (in_stack_ffffffffffffffbc < iVar4) {
            local_58 = in_stack_ffffffffffffffbc;
            if (iVar4 - in_stack_ffffffffffffffbc < 0x11) {
              local_78 = iVar4 - in_stack_ffffffffffffffbc;
            }
            else {
              local_78 = 0x10;
            }
            while (in_stack_ffffffffffffffac = local_78 + -1, local_78 != 0) {
              local_18[*(int *)(g_ZAG + (long)local_58 * 4)] = 0;
              local_58 = local_58 + 1;
              local_78 = in_stack_ffffffffffffffac;
            }
          }
          in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc + 0xf;
        }
        else {
          if (local_2c != 0) {
            if (0x3f < in_stack_ffffffffffffffbc + local_2c) {
              stop_decoding((jpeg_decoder *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            in_stack_ffffffffffffff8c);
            }
            if (in_stack_ffffffffffffffbc < iVar4) {
              in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffbc;
              iVar3 = local_2c;
              in_stack_ffffffffffffff90 = local_2c;
              if (iVar4 - in_stack_ffffffffffffffbc <= local_2c) {
                in_stack_ffffffffffffff90 = iVar4 - in_stack_ffffffffffffffbc;
                iVar3 = in_stack_ffffffffffffff90;
              }
              while (in_stack_ffffffffffffffb4 = iVar3 + -1, iVar3 != 0) {
                local_18[*(int *)(g_ZAG + (long)in_stack_ffffffffffffffb0 * 4)] = 0;
                in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb0 + 1;
                iVar3 = in_stack_ffffffffffffffb4;
              }
            }
            in_stack_ffffffffffffffbc = local_2c + in_stack_ffffffffffffffbc;
          }
          in_stack_ffffffffffffff8c = in_stack_ffffffffffffffb8;
          if (in_stack_ffffffffffffffb8 < *(jpgd_status *)(s_extend_test + (long)(int)uVar2 * 4)) {
            in_stack_ffffffffffffff8c =
                 in_stack_ffffffffffffffb8 + *(int *)(s_extend_offset + (long)(int)uVar2 * 4);
          }
          iVar3 = dequantize_ac(in_stack_ffffffffffffff8c,(int)psVar1[in_stack_ffffffffffffffbc]);
          local_18[*(int *)(g_ZAG + (long)in_stack_ffffffffffffffbc * 4)] = (short)iVar3;
        }
      }
      local_5c = in_stack_ffffffffffffffbc;
      if (in_stack_ffffffffffffffbc < iVar4) {
        while (local_5c < iVar4) {
          local_18[*(int *)(g_ZAG + (long)local_5c * 4)] = 0;
          local_5c = local_5c + 1;
        }
      }
      *(int *)(in_RDI + 0x2508 + (long)local_1c * 4) = in_stack_ffffffffffffffbc;
      local_18 = local_18 + 0x40;
    }
    if ((*(byte *)(in_RDI + 0x24e4) & 1) == 0) {
      transform_mcu((jpeg_decoder *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffac);
    }
    else {
      transform_mcu_expand(in_stack_000001d0,in_stack_000001cc);
    }
    *(int *)(in_RDI + 0x24c8) = *(int *)(in_RDI + 0x24c8) + -1;
    local_c = local_c + 1;
  } while( true );
}

Assistant:

void jpeg_decoder::decode_next_row() {
  for (int mcu_row = 0; mcu_row < m_mcus_per_row; mcu_row++) {
    if ((m_restart_interval) && (m_restarts_left == 0))
      process_restart();

    jpgd_block_t* p = m_pMCU_coefficients;
    for (int mcu_block = 0; mcu_block < m_blocks_per_mcu; mcu_block++, p += 64) {
      int component_id = m_mcu_org[mcu_block];
      jpgd_quant_t* q = m_quant[m_comp_quant[component_id]];

      int r, s;
      s = huff_decode(m_pHuff_tabs[m_comp_dc_tab[component_id]], r);
      s = JPGD_HUFF_EXTEND(r, s);

      m_last_dc_val[component_id] = (s += m_last_dc_val[component_id]);

      p[0] = static_cast<jpgd_block_t>(s * q[0]);

      int prev_num_set = m_mcu_block_max_zag[mcu_block];

      huff_tables* pH = m_pHuff_tabs[m_comp_ac_tab[component_id]];

      int k;
      for (k = 1; k < 64; k++) {
        int extra_bits;
        s = huff_decode(pH, extra_bits);

        r = s >> 4;
        s &= 15;

        if (s) {
          if (r) {
            if ((k + r) > 63)
              stop_decoding(JPGD_DECODE_ERROR);

            if (k < prev_num_set) {
              int n = JPGD_MIN(r, prev_num_set - k);
              int kt = k;
              while (n--)
                p[g_ZAG[kt++]] = 0;
            }

            k += r;
          }

          s = JPGD_HUFF_EXTEND(extra_bits, s);

          JPGD_ASSERT(k < 64);

          p[g_ZAG[k]] = static_cast<jpgd_block_t>(dequantize_ac(s, q[k]));  //s * q[k];
        } else {
          if (r == 15) {
            if ((k + 16) > 64)
              stop_decoding(JPGD_DECODE_ERROR);

            if (k < prev_num_set) {
              int n = JPGD_MIN(16, prev_num_set - k);
              int kt = k;
              while (n--) {
                JPGD_ASSERT(kt <= 63);
                p[g_ZAG[kt++]] = 0;
              }
            }

            k += 16 - 1;  // - 1 because the loop counter is k
            JPGD_ASSERT(p[g_ZAG[k]] == 0);
          } else
            break;
        }
      }

      if (k < prev_num_set) {
        int kt = k;
        while (kt < prev_num_set)
          p[g_ZAG[kt++]] = 0;
      }

      m_mcu_block_max_zag[mcu_block] = k;
    }

    if (m_freq_domain_chroma_upsample)
      transform_mcu_expand(mcu_row);
    else
      transform_mcu(mcu_row);

    m_restarts_left--;
  }
}